

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Span.cpp
# Opt level: O0

string * __thiscall
jaegertracing::Span::serviceNameNoLock_abi_cxx11_(string *__return_storage_ptr__,Span *this)

{
  bool bVar1;
  element_type *this_00;
  string *psVar2;
  Span *this_local;
  
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&this->_tracer);
  if (bVar1) {
    this_00 = std::
              __shared_ptr_access<const_jaegertracing::Tracer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<const_jaegertracing::Tracer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)&this->_tracer);
    psVar2 = Tracer::serviceName_abi_cxx11_(this_00);
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)psVar2);
  }
  else {
    std::__cxx11::string::string((string *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Span::serviceNameNoLock() const noexcept
{
    if (!_tracer) {
        return std::string();
    }
    return _tracer->serviceName();
}